

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_prg.c
# Opt level: O0

int tool_progress_cb(void *clientp,curl_off_t dltotal,curl_off_t dlnow,curl_off_t ultotal,
                    curl_off_t ulnow)

{
  int iVar1;
  long lVar2;
  long lVar3;
  timeval newer;
  curl_off_t point;
  curl_off_t total;
  ProgressData *bar;
  timeval now;
  int num;
  int barwidth;
  double percent;
  double frac;
  char format [40];
  undefined1 local_148 [8];
  char line [257];
  curl_off_t ulnow_local;
  curl_off_t ultotal_local;
  curl_off_t dlnow_local;
  curl_off_t dltotal_local;
  void *clientp_local;
  
  newer = tvnow();
  point = dltotal + ultotal + *(long *)((long)clientp + 0x30);
  lVar2 = dlnow + ulnow + *(long *)((long)clientp + 0x30);
  if (*clientp != 0) {
    if (point == 0) {
      lVar3 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
      if (lVar3 < 100) {
        return 0;
      }
      fly((ProgressData *)clientp,lVar2 != *(long *)((long)clientp + 8));
    }
    else {
      if (*(long *)((long)clientp + 8) == lVar2) {
        return 0;
      }
      lVar3 = tvdiff(newer,*(timeval *)((long)clientp + 0x10));
      if ((lVar3 < 100) && (lVar2 < point)) {
        return 0;
      }
    }
  }
  *(int *)clientp = *clientp + 1;
  if ((0 < point) && (lVar2 != *(long *)((long)clientp + 8))) {
    if (point < lVar2) {
      point = lVar2;
    }
    iVar1 = *(int *)((long)clientp + 0x20) + -7;
    now.tv_usec._0_4_ = (int)((double)iVar1 * ((double)lVar2 / (double)point));
    if (0x100 < (int)now.tv_usec) {
      now.tv_usec._0_4_ = 0x100;
    }
    memset(local_148,0x23,(long)(int)now.tv_usec);
    local_148[(int)now.tv_usec] = 0;
    curl_msnprintf(&frac,0x28,"\r%%-%ds %%5.1f%%%%",iVar1);
    curl_mfprintf(((double)lVar2 / (double)point) * 100.0,*(undefined8 *)((long)clientp + 0x28),
                  &frac,local_148);
  }
  fflush(*(FILE **)((long)clientp + 0x28));
  *(long *)((long)clientp + 8) = lVar2;
  bar = (ProgressData *)newer.tv_sec;
  *(ProgressData **)((long)clientp + 0x10) = bar;
  now.tv_sec = newer.tv_usec;
  *(__time_t *)((long)clientp + 0x18) = now.tv_sec;
  return 0;
}

Assistant:

int tool_progress_cb(void *clientp,
                     curl_off_t dltotal, curl_off_t dlnow,
                     curl_off_t ultotal, curl_off_t ulnow)
{
  /* The original progress-bar source code was written for curl by Lars Aas,
     and this new edition inherits some of his concepts. */

  char line[MAX_BARLENGTH + 1];
  char format[40];
  double frac;
  double percent;
  int barwidth;
  int num;
  struct timeval now = tvnow();
  struct ProgressData *bar = (struct ProgressData *)clientp;
  curl_off_t total;
  curl_off_t point;

  /* expected transfer size */
  total = dltotal + ultotal + bar->initial_size;

  /* we've come this far */
  point = dlnow + ulnow + bar->initial_size;

  if(bar->calls) {
    /* after first call... */
    if(total) {
      /* we know the total data to get... */
      if(bar->prev == point)
        /* progress didn't change since last invoke */
        return 0;
      else if((tvdiff(now, bar->prevtime) < 100L) && point < total)
        /* limit progress-bar updating to 10 Hz except when we're at 100% */
        return 0;
    }
    else {
      /* total is unknown */
      if(tvdiff(now, bar->prevtime) < 100L)
        /* limit progress-bar updating to 10 Hz */
        return 0;
      fly(bar, point != bar->prev);
    }
  }

  /* simply count invokes */
  bar->calls++;

  if((total > 0) && (point != bar->prev)) {
    if(point > total)
      /* we have got more than the expected total! */
      total = point;

    frac = (double)point / (double)total;
    percent = frac * 100.0;
    barwidth = bar->width - 7;
    num = (int) (((double)barwidth) * frac);
    if(num > MAX_BARLENGTH)
      num = MAX_BARLENGTH;
    memset(line, '#', num);
    line[num] = '\0';
    snprintf(format, sizeof(format), "\r%%-%ds %%5.1f%%%%", barwidth);
    fprintf(bar->out, format, line, percent);
  }
  fflush(bar->out);
  bar->prev = point;
  bar->prevtime = now;

  return 0;
}